

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  stbi_uc *psVar10;
  long lVar11;
  byte *pbVar12;
  stbi__uint32 sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  byte bVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  stbi_uc *psVar29;
  byte *pbVar30;
  ulong uVar31;
  bool bVar32;
  stbi_uc *local_e8;
  stbi_uc *local_d0;
  byte *local_c8;
  ulong local_70;
  ulong uVar23;
  
  bVar32 = depth == 0x10;
  uVar6 = x * out_n;
  uVar7 = uVar6 << bVar32;
  iVar2 = a->s->img_n;
  uVar8 = iVar2 << bVar32;
  if (iVar2 + 1 != out_n && iVar2 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                  ,0x10c6,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar10 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar32,0);
  a->out = psVar10;
  if (psVar10 == (stbi_uc *)0x0) {
    pcVar17 = "Out of memory";
  }
  else {
    uVar9 = iVar2 * x;
    uVar21 = uVar9 * depth + 7 >> 3;
    uVar23 = (ulong)uVar21;
    pcVar17 = "Corrupt PNG";
    if ((uVar21 + 1) * y <= raw_len) {
      lVar11 = (long)iVar2;
      lVar27 = (long)(out_n << bVar32);
      lVar28 = -lVar27;
      lVar18 = -(ulong)uVar7;
      uVar22 = 0;
      uVar26 = 0;
      local_70 = (ulong)x;
      while( true ) {
        if (uVar26 == y) {
          if (7 < depth) {
            if (depth != 0x10) {
              return 1;
            }
            psVar10 = a->out;
            for (lVar11 = 0; uVar6 * y != (int)lVar11; lVar11 = lVar11 + 1) {
              puVar1 = (ushort *)(psVar10 + lVar11 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            }
            return 1;
          }
          uVar8 = 0;
          uVar26 = 0;
          do {
            if (uVar26 == y) {
              return 1;
            }
            bVar5 = 1;
            if (color == 0) {
              bVar5 = ""[depth];
            }
            uVar20 = (ulong)uVar8;
            psVar10 = a->out;
            uVar16 = (ulong)(uVar7 * (int)uVar26);
            if (depth == 4) {
              lVar11 = (uVar6 - uVar23) + uVar20;
              lVar18 = 0;
              for (uVar21 = uVar9; 1 < (int)uVar21; uVar21 = uVar21 - 2) {
                psVar10[lVar18 * 2 + uVar20] = (psVar10[lVar18 + lVar11] >> 4) * bVar5;
                psVar10[lVar18 * 2 + uVar20 + 1] = (psVar10[lVar18 + lVar11] & 0xf) * bVar5;
                lVar18 = lVar18 + 1;
              }
              if (uVar21 == 1) {
                psVar10[lVar18 * 2 + uVar20] = (psVar10[lVar18 + lVar11] >> 4) * bVar5;
              }
            }
            else {
              pbVar30 = psVar10 + ((uVar6 + uVar16) - uVar23);
              if (depth == 2) {
                psVar10 = psVar10 + uVar20 + 3;
                for (uVar21 = uVar9; 3 < (int)uVar21; uVar21 = uVar21 - 4) {
                  psVar10[-3] = (*pbVar30 >> 6) * bVar5;
                  psVar10[-2] = (*pbVar30 >> 4 & 3) * bVar5;
                  psVar10[-1] = (*pbVar30 >> 2 & 3) * bVar5;
                  *psVar10 = (*pbVar30 & 3) * bVar5;
                  pbVar30 = pbVar30 + 1;
                  psVar10 = psVar10 + 4;
                }
                if (((0 < (int)uVar21) && (psVar10[-3] = (*pbVar30 >> 6) * bVar5, uVar21 != 1)) &&
                   (psVar10[-2] = (*pbVar30 >> 4 & 3) * bVar5, uVar21 == 3)) {
                  psVar10[-1] = (*pbVar30 >> 2 & 3) * bVar5;
                }
              }
              else if (depth == 1) {
                pbVar12 = psVar10 + uVar20 + 7;
                for (uVar21 = uVar9; 7 < (int)uVar21; uVar21 = uVar21 - 8) {
                  pbVar12[-7] = (char)*pbVar30 >> 7 & bVar5;
                  pbVar12[-6] = (char)(*pbVar30 * '\x02') >> 7 & bVar5;
                  pbVar12[-5] = (char)(*pbVar30 << 2) >> 7 & bVar5;
                  pbVar12[-4] = (char)(*pbVar30 << 3) >> 7 & bVar5;
                  pbVar12[-3] = (char)(*pbVar30 << 4) >> 7 & bVar5;
                  pbVar12[-2] = (char)(*pbVar30 << 5) >> 7 & bVar5;
                  pbVar12[-1] = (char)(*pbVar30 << 6) >> 7 & bVar5;
                  bVar24 = bVar5;
                  if ((*pbVar30 & 1) == 0) {
                    bVar24 = 0;
                  }
                  *pbVar12 = bVar24;
                  pbVar30 = pbVar30 + 1;
                  pbVar12 = pbVar12 + 8;
                }
                if (((((0 < (int)uVar21) && (pbVar12[-7] = (char)*pbVar30 >> 7 & bVar5, uVar21 != 1)
                      ) && ((pbVar12[-6] = (char)(*pbVar30 * '\x02') >> 7 & bVar5, 2 < uVar21 &&
                            ((pbVar12[-5] = (char)(*pbVar30 << 2) >> 7 & bVar5, uVar21 != 3 &&
                             (pbVar12[-4] = (char)(*pbVar30 << 3) >> 7 & bVar5, 4 < uVar21)))))) &&
                    (pbVar12[-3] = (char)(*pbVar30 << 4) >> 7 & bVar5, uVar21 != 5)) &&
                   (pbVar12[-2] = (char)(*pbVar30 << 5) >> 7 & bVar5, uVar21 == 7)) {
                  pbVar12[-1] = (char)(*pbVar30 << 6) >> 7 & bVar5;
                }
              }
            }
            if (iVar2 != out_n) {
              psVar10 = a->out;
              if (iVar2 == 1) {
                uVar21 = x * 2 - 1;
                for (iVar25 = 0; -1 < (int)((x - 1) + iVar25); iVar25 = iVar25 + -1) {
                  psVar10[uVar21 + uVar16] = 0xff;
                  psVar10[(uVar21 - 1) + uVar16] = psVar10[((x - 1) + iVar25 & 0x7fffffff) + uVar16]
                  ;
                  uVar21 = uVar21 - 2;
                }
              }
              else {
                iVar25 = x - 1;
                uVar22 = x * 4;
                uVar21 = x * 3;
                if (iVar2 != 3) {
                  __assert_fail("img_n == 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                                ,0x1171,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                while( true ) {
                  uVar21 = uVar21 - 3;
                  if (iVar25 < 0) break;
                  psVar10[(uVar22 - 1) + uVar16] = 0xff;
                  psVar10[(uVar22 - 2) + uVar16] = psVar10[(ulong)uVar21 + uVar16 + 2];
                  psVar10[(uVar22 - 3) + uVar16] = psVar10[(ulong)uVar21 + uVar16 + 1];
                  psVar10[(uVar22 - 4) + uVar16] = psVar10[uVar21 + uVar16];
                  iVar25 = iVar25 + -1;
                  uVar22 = uVar22 - 4;
                }
              }
            }
            uVar26 = uVar26 + 1;
            uVar8 = uVar8 + uVar7;
          } while( true );
        }
        uVar16 = (ulong)*raw;
        if (4 < uVar16) break;
        local_e8 = a->out + uVar7 * (int)uVar26;
        if (depth < 8) {
          if (x < uVar21) {
            __assert_fail("img_width_bytes <= x",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                          ,0x10da,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          local_e8 = local_e8 + (uVar6 - uVar21);
          uVar8 = 1;
          local_70 = uVar23;
        }
        if (uVar26 == 0) {
          uVar16 = (ulong)""[uVar16];
        }
        uVar20 = 0;
        if (0 < (int)uVar8) {
          uVar20 = (ulong)uVar8;
        }
        for (uVar31 = 0; uVar20 != uVar31; uVar31 = uVar31 + 1) {
          switch(uVar16) {
          case 0:
          case 1:
          case 5:
          case 6:
            bVar5 = raw[uVar31 + 1];
            break;
          case 2:
            bVar5 = local_e8[uVar31 + lVar18];
            goto LAB_0012096a;
          case 3:
            bVar5 = local_e8[uVar31 + lVar18] >> 1;
LAB_0012096a:
            bVar5 = bVar5 + raw[uVar31 + 1];
            break;
          case 4:
            bVar5 = raw[uVar31 + 1];
            iVar25 = stbi__paeth(0,(uint)local_e8[uVar31 + lVar18],0);
            bVar5 = (char)iVar25 + bVar5;
            break;
          default:
            goto switchD_00120929_default;
          }
          local_e8[uVar31] = bVar5;
switchD_00120929_default:
        }
        lVar14 = (long)(int)uVar8;
        if (depth == 8) {
          lVar15 = (long)out_n;
          lVar3 = lVar11;
          if (iVar2 != out_n) {
            local_e8[lVar11] = 0xff;
          }
LAB_001209ea:
          local_c8 = raw + lVar3 + 1;
        }
        else {
          if (depth == 0x10) {
            lVar15 = lVar27;
            lVar3 = lVar14;
            if (iVar2 != out_n) {
              local_e8[lVar14] = 0xff;
              local_e8[lVar14 + 1] = 0xff;
            }
            goto LAB_001209ea;
          }
          local_c8 = raw + 2;
          lVar15 = 1;
        }
        psVar10 = local_e8 + lVar15;
        local_d0 = local_e8 + lVar15 + lVar18;
        if (depth < 8 || iVar2 == out_n) {
          uVar19 = ((int)local_70 + -1) * uVar8;
          switch(uVar16) {
          case 0:
            memcpy(psVar10,local_c8,(long)(int)uVar19);
            break;
          case 1:
            uVar4 = uVar19;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
              psVar10[uVar16] = psVar10[uVar16 - lVar14] + local_c8[uVar16];
            }
            break;
          case 2:
            uVar4 = uVar19;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
              psVar10[uVar16] = psVar10[uVar16 + lVar18] + local_c8[uVar16];
            }
            break;
          case 3:
            uVar4 = uVar19;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            uVar16 = (ulong)uVar4;
            pbVar30 = local_c8;
            while (bVar32 = uVar16 != 0, uVar16 = uVar16 - 1, bVar32) {
              *psVar10 = (char)((uint)psVar10[-lVar14] + (uint)psVar10[lVar18] >> 1) + *pbVar30;
              psVar10 = psVar10 + 1;
              pbVar30 = pbVar30 + 1;
            }
            break;
          case 4:
            uVar4 = uVar19;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (uVar16 = 0; uVar16 != uVar4; uVar16 = uVar16 + 1) {
              bVar5 = local_c8[uVar16];
              iVar25 = stbi__paeth((uint)psVar10[uVar16 - lVar14],(uint)local_d0[uVar16],
                                   (uint)local_d0[uVar16 - lVar14]);
              psVar10[uVar16] = (char)iVar25 + bVar5;
            }
            break;
          case 5:
            uVar4 = uVar19;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
              psVar10[uVar16] = (psVar10[uVar16 - lVar14] >> 1) + local_c8[uVar16];
            }
            break;
          case 6:
            uVar4 = uVar19;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
              psVar10[uVar16] = psVar10[uVar16 - lVar14] + local_c8[uVar16];
            }
          }
          local_c8 = local_c8 + (int)uVar19;
        }
        else {
          if (iVar2 + 1 != out_n) {
            __assert_fail("img_n+1 == out_n",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                          ,0x1118,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          switch(uVar16) {
          case 0:
            sVar13 = x;
            while (sVar13 = sVar13 - 1, sVar13 != 0) {
              for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                psVar10[uVar16] = local_c8[uVar16];
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar27;
            }
            break;
          case 1:
            sVar13 = x;
            while (sVar13 = sVar13 - 1, sVar13 != 0) {
              for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                psVar10[uVar16] = psVar10[uVar16 + lVar28] + local_c8[uVar16];
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar27;
            }
            break;
          case 2:
            sVar13 = x;
            while (sVar13 = sVar13 - 1, sVar13 != 0) {
              for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                psVar10[uVar16] = psVar10[uVar16 + lVar18] + local_c8[uVar16];
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar27;
            }
            break;
          case 3:
            sVar13 = x;
            while (sVar13 = sVar13 - 1, pbVar30 = local_c8, psVar29 = psVar10, uVar16 = uVar20,
                  sVar13 != 0) {
              while (uVar16 != 0) {
                *psVar29 = (char)((uint)psVar29[lVar28] + (uint)psVar29[lVar18] >> 1) + *pbVar30;
                pbVar30 = pbVar30 + 1;
                psVar29 = psVar29 + 1;
                uVar16 = uVar16 - 1;
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar27;
            }
            break;
          case 4:
            psVar29 = local_e8 + lVar15 + lVar28;
            local_e8 = local_e8 + lVar15 + (lVar28 - (ulong)uVar7);
            sVar13 = x;
            while (sVar13 = sVar13 - 1, sVar13 != 0) {
              for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                bVar5 = local_c8[uVar16];
                iVar25 = stbi__paeth((uint)psVar29[uVar16],(uint)local_d0[uVar16],
                                     (uint)local_e8[uVar16]);
                psVar10[uVar16] = (char)iVar25 + bVar5;
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar27;
              local_d0 = local_d0 + lVar27;
              psVar29 = psVar29 + lVar27;
              local_e8 = local_e8 + lVar27;
            }
            break;
          case 5:
            sVar13 = x;
            while (sVar13 = sVar13 - 1, sVar13 != 0) {
              for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                psVar10[uVar16] = (psVar10[uVar16 + lVar28] >> 1) + local_c8[uVar16];
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar27;
            }
            break;
          case 6:
            sVar13 = x;
            while (sVar13 = sVar13 - 1, sVar13 != 0) {
              for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                psVar10[uVar16] = psVar10[uVar16 + lVar28] + local_c8[uVar16];
              }
              psVar10[lVar14] = 0xff;
              local_c8 = local_c8 + lVar14;
              psVar10 = psVar10 + lVar27;
            }
          }
          if (depth == 0x10) {
            psVar10 = a->out + (long)(int)(uVar8 + 1) + (ulong)uVar22;
            sVar13 = x;
            while (bVar32 = sVar13 != 0, sVar13 = sVar13 - 1, bVar32) {
              *psVar10 = 0xff;
              psVar10 = psVar10 + lVar27;
            }
          }
        }
        uVar26 = uVar26 + 1;
        uVar22 = uVar22 + uVar7;
        raw = local_c8;
      }
      pcVar17 = "Corrupt PNG";
    }
  }
  stbi__g_failure_reason = pcVar17;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }